

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O1

int duckdb_shell_sqlite3_prepare_v2
              (sqlite3 *db,char *zSql,int nByte,sqlite3_stmt **ppStmt,char **pzTail)

{
  unsigned_long __val;
  _Head_base<0UL,_duckdb::PendingQueryResult_*,_false> _Var1;
  ParserOptions options_p;
  ErrorData *pEVar2;
  ExceptionType EVar3;
  _Head_base<0UL,_sqlite3_stmt_*,_false> _Var4;
  undefined8 uVar5;
  char cVar6;
  bool bVar7;
  size_t sVar8;
  pointer pCVar9;
  ClientContext *pCVar10;
  reference pvVar11;
  pointer pSVar12;
  pointer pMVar13;
  ErrorData *pEVar14;
  sqlite3_stmt *__s;
  pointer psVar15;
  pointer pPVar16;
  pointer pPVar17;
  ErrorData *pEVar18;
  __uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
  *p_Var19;
  unsigned_long uVar20;
  __uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_> _Var21
  ;
  ulong uVar22;
  int iVar23;
  char cVar24;
  unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> stmt;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  string query;
  string __str;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  res;
  Parser parser;
  _Head_base<0UL,_sqlite3_stmt_*,_false> local_1d8;
  sqlite3 *local_1d0;
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *local_1c8;
  SQLStatement *local_1c0;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_1b8;
  idx_t local_198;
  char *local_190;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_188;
  SQLStatement *local_180;
  char **local_178;
  string local_170;
  char *local_150;
  uint local_148;
  char local_140 [16];
  undefined1 local_130 [24];
  _Head_base<0UL,_duckdb::PreparedStatement_*,_false> _Stack_118;
  ulong local_b0;
  sqlite3_stmt **local_a8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_a0;
  string *local_98;
  Parser local_90;
  ParserOptions local_60;
  LogicalType local_48;
  
  iVar23 = 0x15;
  if (((zSql != (char *)0x0) && (db != (sqlite3 *)0x0)) && (ppStmt != (sqlite3_stmt **)0x0)) {
    *ppStmt = (sqlite3_stmt *)0x0;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    local_1d0 = db;
    local_190 = zSql;
    local_178 = pzTail;
    local_a8 = ppStmt;
    if (nByte < 0) {
      sVar8 = strlen(zSql);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,zSql,zSql + sVar8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,zSql,zSql + (uint)nByte);
    }
    if (local_178 != (char **)0x0) {
      *local_178 = local_190 + local_170._M_string_length;
    }
    local_1c8 = &local_1d0->con;
    pCVar9 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
             operator->(local_1c8);
    pCVar10 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(&pCVar9->context);
    duckdb::ClientContext::GetParserOptions(&local_60,pCVar10);
    options_p.max_expression_depth = local_60.max_expression_depth;
    options_p.preserve_identifier_case = local_60.preserve_identifier_case;
    options_p.integer_division = local_60.integer_division;
    options_p._2_6_ = local_60._2_6_;
    options_p.extensions = local_60.extensions;
    duckdb::Parser::Parser(&local_90,options_p);
    duckdb::Parser::ParseQuery(&local_90,&local_170);
    if (local_90.statements.
        super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_90.statements.
        super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iVar23 = 0;
    }
    else {
      pvVar11 = duckdb::
                vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                ::operator[](&local_90.statements,0);
      pSVar12 = duckdb::
                unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
                operator->(pvVar11);
      local_198 = pSVar12->stmt_location;
      pvVar11 = duckdb::
                vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                ::operator[](&local_90.statements,0);
      pSVar12 = duckdb::
                unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
                operator->(pvVar11);
      local_198 = local_198 + pSVar12->stmt_length;
      local_b0 = local_170._M_string_length;
      local_1b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar11 = duckdb::
                vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                ::operator[](&local_90.statements,0);
      std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
                ((vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
                  *)&local_1b8,pvVar11);
      pCVar9 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
               ::operator->(local_1c8);
      pCVar10 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(&pCVar9->context);
      duckdb::ClientContext::HandlePragmaStatements
                (pCVar10,(vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                          *)&local_1b8);
      if (local_1b8.
          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_1b8.
          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar23 = 0;
      }
      else {
        if (8 < (ulong)((long)local_1b8.
                              super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1b8.
                             super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          pEVar18 = &local_1d0->last_error;
          local_98 = (string *)&(local_1d0->last_error).raw_message;
          pEVar2 = &local_1d0->last_error;
          local_a0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(local_1d0->last_error).extra_info;
          uVar22 = 1;
          do {
            pCVar9 = duckdb::
                     unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
                     operator->(local_1c8);
            pvVar11 = duckdb::
                      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                                    *)&local_1b8,uVar22 - 1);
            local_1c0 = (pvVar11->
                        super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                        .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
            (pvVar11->
            super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t
            .super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
            .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0
            ;
            duckdb::Connection::Query
                      ((Connection *)local_130,
                       (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                        *)pCVar9);
            if (local_1c0 != (SQLStatement *)0x0) {
              (*local_1c0->_vptr_SQLStatement[1])();
            }
            local_1c0 = (SQLStatement *)0x0;
            pMVar13 = duckdb::
                      unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                      ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                    *)local_130);
            bVar7 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)pMVar13);
            if (bVar7) {
              pMVar13 = duckdb::
                        unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                        ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                      *)local_130);
              pEVar14 = duckdb::BaseQueryResult::GetErrorObject((BaseQueryResult *)pMVar13);
              EVar3 = pEVar14->type;
              pEVar18->initialized = pEVar14->initialized;
              pEVar18->type = EVar3;
              std::__cxx11::string::_M_assign(local_98);
              std::__cxx11::string::_M_assign((string *)&pEVar2->final_message);
              if (pEVar14 != pEVar18) {
                std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::
                _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                          (local_a0,&(pEVar14->extra_info)._M_h);
              }
              if ((element_type *)local_130._0_8_ != (element_type *)0x0) {
                (*((BaseQueryResult *)local_130._0_8_)->_vptr_BaseQueryResult[1])();
              }
              if (bVar7) {
                iVar23 = 1;
                goto LAB_00228fb8;
              }
            }
            else if ((_Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                      )local_130._0_8_ != (PreparedStatement *)0x0) {
              (**(code **)(*(long *)local_130._0_8_ + 8))();
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < (ulong)((long)local_1b8.
                                          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1b8.
                                          super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        __s = (sqlite3_stmt *)operator_new(0x88);
        switchD_005700f1::default(__s,0,0x88);
        (__s->query_string)._M_dataplus._M_p = (pointer)&(__s->query_string).field_2;
        (__s->query_string)._M_string_length = 0;
        (__s->query_string).field_2._M_local_buf[0] = '\0';
        (__s->prepared).
        super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
        .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl =
             (PreparedStatement *)0x0;
        (__s->pending).
        super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
        .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
             (PendingQueryResult *)0x0;
        (__s->result).
        super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
        super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
        super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = (QueryResult *)0x0;
        (__s->current_chunk).
        super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
        super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
        (__s->bound_values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__s->bound_values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__s->bound_values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__s->bound_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__s->bound_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__s->bound_names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__s->current_text).
        super_unique_ptr<sqlite3_string_buffer[],_std::default_delete<sqlite3_string_buffer[]>_>.
        _M_t.
        super___uniq_ptr_impl<sqlite3_string_buffer,_std::default_delete<sqlite3_string_buffer[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_sqlite3_string_buffer_*,_std::default_delete<sqlite3_string_buffer[]>_>
        .super__Head_base<0UL,_sqlite3_string_buffer_*,_false>._M_head_impl =
             (sqlite3_string_buffer *)0x0;
        local_1d8._M_head_impl = __s;
        psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                  operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                             &local_1d8);
        psVar15->db = local_1d0;
        psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                  operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                             &local_1d8);
        std::__cxx11::string::_M_assign((string *)&psVar15->query_string);
        pvVar11 = duckdb::
                  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                  ::back((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                          *)&local_1b8);
        pSVar12 = duckdb::
                  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  ::operator->(pvVar11);
        if ((pSVar12->named_param_map)._M_h._M_element_count == 0) {
          pCVar9 = duckdb::
                   unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
                   operator->(local_1c8);
          pvVar11 = duckdb::
                    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                    ::back((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                            *)&local_1b8);
          local_188._M_head_impl =
               (pvVar11->
               super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
               _M_t.
               super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
               .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
          (pvVar11->
          super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
          super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
          .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
          duckdb::Connection::PendingQuery
                    ((Connection *)local_130,
                     (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)pCVar9,SUB81(&local_188,0));
          if (local_188._M_head_impl != (SQLStatement *)0x0) {
            (*(local_188._M_head_impl)->_vptr_SQLStatement[1])();
          }
          local_188._M_head_impl = (SQLStatement *)0x0;
          pPVar17 = duckdb::
                    unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                    ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                  *)local_130);
          bVar7 = duckdb::BaseQueryResult::HasError(&pPVar17->super_BaseQueryResult);
          if (bVar7) {
            pPVar17 = duckdb::
                      unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                      ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                    *)local_130);
            pEVar18 = duckdb::BaseQueryResult::GetErrorObject(&pPVar17->super_BaseQueryResult);
            EVar3 = pEVar18->type;
            (local_1d0->last_error).initialized = pEVar18->initialized;
            (local_1d0->last_error).type = EVar3;
            std::__cxx11::string::_M_assign((string *)&(local_1d0->last_error).raw_message);
            std::__cxx11::string::_M_assign((string *)&(local_1d0->last_error).final_message);
            if (pEVar18 != &local_1d0->last_error) {
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&(local_1d0->last_error).extra_info,&(pEVar18->extra_info)._M_h);
            }
          }
          else {
            psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                      operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>
                                  *)&local_1d8);
            uVar5 = local_130._0_8_;
            local_130._0_8_ =
                 (tuple<duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                  )0x0;
            _Var1._M_head_impl =
                 (psVar15->pending).
                 super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
                 .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl;
            (psVar15->pending).
            super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
            .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
                 (PendingQueryResult *)uVar5;
            if (_Var1._M_head_impl != (PendingQueryResult *)0x0) {
              (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseQueryResult + 8))();
            }
          }
          if ((element_type *)local_130._0_8_ != (element_type *)0x0) {
            (*((BaseQueryResult *)local_130._0_8_)->_vptr_BaseQueryResult[1])();
          }
        }
        else {
          pCVar9 = duckdb::
                   unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
                   operator->(local_1c8);
          pvVar11 = duckdb::
                    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                    ::back((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                            *)&local_1b8);
          local_180 = (pvVar11->
                      super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                      .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
          (pvVar11->
          super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
          super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
          .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
          duckdb::Connection::Prepare
                    ((Connection *)local_130,
                     (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)pCVar9);
          if (local_180 != (SQLStatement *)0x0) {
            (*local_180->_vptr_SQLStatement[1])();
          }
          local_180 = (SQLStatement *)0x0;
          pPVar16 = duckdb::
                    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                    ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                                  *)local_130);
          bVar7 = duckdb::PreparedStatement::HasError(pPVar16);
          if (bVar7) {
            pPVar16 = duckdb::
                      unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                      ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                                    *)local_130);
            EVar3 = (pPVar16->error).type;
            (local_1d0->last_error).initialized = (pPVar16->error).initialized;
            (local_1d0->last_error).type = EVar3;
            std::__cxx11::string::_M_assign((string *)&(local_1d0->last_error).raw_message);
            std::__cxx11::string::_M_assign((string *)&(local_1d0->last_error).final_message);
            if (&pPVar16->error != &local_1d0->last_error) {
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&(local_1d0->last_error).extra_info,&(pPVar16->error).extra_info._M_h);
            }
          }
          else {
            psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                      operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>
                                  *)&local_1d8);
            uVar5 = local_130._0_8_;
            local_130._0_8_ =
                 (tuple<duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                  )0x0;
            std::
            __uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
            ::reset((__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                     *)&psVar15->prepared,(pointer)uVar5);
          }
          uVar5 = local_130._0_8_;
          if ((element_type *)local_130._0_8_ != (element_type *)0x0) {
            duckdb::PreparedStatement::~PreparedStatement((PreparedStatement *)local_130._0_8_);
            operator_delete((void *)uVar5);
          }
        }
        iVar23 = 1;
        if (bVar7 == false) {
          psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                               &local_1d8);
          psVar15->current_row = -1;
          psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                               &local_1d8);
          if ((psVar15->prepared).
              super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
              .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl !=
              (PreparedStatement *)0x0) {
            uVar22 = 0;
            while( true ) {
              psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                        operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>
                                    *)&local_1d8);
              pPVar16 = duckdb::
                        unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                        ::operator->(&psVar15->prepared);
              if ((pPVar16->named_param_map)._M_h._M_element_count <= uVar22) break;
              psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                        operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>
                                    *)&local_1d8);
              __val = uVar22 + 1;
              cVar24 = '\x01';
              if (8 < uVar22) {
                uVar20 = __val;
                cVar6 = '\x04';
                do {
                  cVar24 = cVar6;
                  if (uVar20 < 100) {
                    cVar24 = cVar24 + -2;
                    goto LAB_00228e24;
                  }
                  if (uVar20 < 1000) {
                    cVar24 = cVar24 + -1;
                    goto LAB_00228e24;
                  }
                  if (uVar20 < 10000) goto LAB_00228e24;
                  bVar7 = 99999 < uVar20;
                  uVar20 = uVar20 / 10000;
                  cVar6 = cVar24 + '\x04';
                } while (bVar7);
                cVar24 = cVar24 + '\x01';
              }
LAB_00228e24:
              local_150 = local_140;
              std::__cxx11::string::_M_construct((ulong)&local_150,cVar24);
              std::__detail::__to_chars_10_impl<unsigned_long>(local_150,local_148,__val);
              p_Var19 = (__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                         *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x12d9390);
              local_130._0_8_ = (long)local_130 + 0x10;
              _Var21._M_t.
              super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
              .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl =
                   (tuple<duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                    )(p_Var19 + 2);
              if ((_Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                   )p_Var19->_M_t ==
                  (_Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                   )_Var21._M_t.
                    super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                    .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl) {
                local_130._16_8_ =
                     *(undefined8 *)
                      _Var21._M_t.
                      super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                      .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl;
                _Stack_118._M_head_impl = *(PreparedStatement **)&p_Var19[3]._M_t;
              }
              else {
                local_130._16_8_ =
                     *(undefined8 *)
                      _Var21._M_t.
                      super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                      .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl;
                local_130._0_8_ =
                     (_Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                      )p_Var19->_M_t;
              }
              local_130._8_8_ = p_Var19[1]._M_t;
              p_Var19->_M_t =
                   _Var21._M_t.
                   super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                   .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl;
              p_Var19[1]._M_t =
                   (tuple<duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                    )0x0;
              *(undefined1 *)&p_Var19[2]._M_t = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &psVar15->bound_names,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
              if ((element_type *)local_130._0_8_ != (element_type *)(local_130 + 0x10)) {
                operator_delete((void *)local_130._0_8_);
              }
              if (local_150 != local_140) {
                operator_delete(local_150);
              }
              psVar15 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                        operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>
                                    *)&local_1d8);
              duckdb::LogicalType::LogicalType(&local_48,SQLNULL);
              duckdb::Value::Value((Value *)local_130,&local_48);
              std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
              emplace_back<duckdb::Value>
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                         &psVar15->bound_values,(Value *)local_130);
              duckdb::Value::~Value((Value *)local_130);
              duckdb::LogicalType::~LogicalType(&local_48);
              uVar22 = __val;
            }
          }
          _Var4._M_head_impl = local_1d8._M_head_impl;
          if ((local_178 != (char **)0x0) && (local_198 < local_b0)) {
            *local_178 = local_190 + local_198 + 1;
          }
          local_1d8._M_head_impl = (sqlite3_stmt *)0x0;
          *local_a8 = _Var4._M_head_impl;
          iVar23 = 0;
        }
        if (local_1d8._M_head_impl != (sqlite3_stmt *)0x0) {
          std::default_delete<sqlite3_stmt>::operator()
                    ((default_delete<sqlite3_stmt> *)&local_1d8,local_1d8._M_head_impl);
        }
      }
LAB_00228fb8:
      std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector(&local_1b8);
    }
    std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
               *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  return iVar23;
}

Assistant:

int sqlite3_prepare_v2(sqlite3 *db,           /* Database handle */
                       const char *zSql,      /* SQL statement, UTF-8 encoded */
                       int nByte,             /* Maximum length of zSql in bytes. */
                       sqlite3_stmt **ppStmt, /* OUT: Statement handle */
                       const char **pzTail    /* OUT: Pointer to unused portion of zSql */
) {
	if (!db || !ppStmt || !zSql) {
		return SQLITE_MISUSE;
	}
	*ppStmt = nullptr;
	string query = nByte < 0 ? zSql : string(zSql, nByte);
	if (pzTail) {
		*pzTail = zSql + query.size();
	}
	try {
		Parser parser(db->con->context->GetParserOptions());
		parser.ParseQuery(query);
		if (parser.statements.size() == 0) {
			return SQLITE_OK;
		}
		// extract the remainder
		idx_t next_location = parser.statements[0]->stmt_location + parser.statements[0]->stmt_length;
		bool set_remainder = next_location < query.size();

		// extract the first statement
		duckdb::vector<duckdb::unique_ptr<SQLStatement>> statements;
		statements.push_back(std::move(parser.statements[0]));

		db->con->context->HandlePragmaStatements(statements);
		if (statements.empty()) {
			return SQLITE_OK;
		}

		// if there are multiple statements here, we are dealing with an import database statement
		// we directly execute all statements besides the final one
		for (idx_t i = 0; i + 1 < statements.size(); i++) {
			auto res = db->con->Query(std::move(statements[i]));
			if (res->HasError()) {
				db->last_error = res->GetErrorObject();
				return SQLITE_ERROR;
			}
		}

		// create the statement entry
		duckdb::unique_ptr<sqlite3_stmt> stmt = make_uniq<sqlite3_stmt>();
		stmt->db = db;
		stmt->query_string = query;

		if (!statements.back()->named_param_map.empty()) {
			// Use Prepare: there are parameters
			auto prepared = db->con->Prepare(std::move(statements.back()));
			if (prepared->HasError()) {
				// failed to prepare: set the error message
				db->last_error = prepared->error;
				return SQLITE_ERROR;
			}
			stmt->prepared = std::move(prepared);
		} else {
			// Use eager execution: there are no parameters so we can safely create a PendingQuery here
			auto pending = db->con->PendingQuery(std::move(statements.back()), false);
			if (pending->HasError()) {
				// failed to prepare: set the error message
				db->last_error = pending->GetErrorObject();
				return SQLITE_ERROR;
			}
			stmt->pending = std::move(pending);
		}

		stmt->current_row = -1;

		if (stmt->prepared) {
			for (idx_t i = 0; i < stmt->prepared->named_param_map.size(); i++) {
				stmt->bound_names.push_back("$" + to_string(i + 1));
				stmt->bound_values.push_back(Value());
			}
		}

		// extract the remainder of the query and assign it to the pzTail
		if (pzTail && set_remainder) {
			*pzTail = zSql + next_location + 1;
		}

		*ppStmt = stmt.release();
		return SQLITE_OK;
	} catch (std::exception &ex) {
		db->last_error = ErrorData(ex);
		db->con->context->ProcessError(db->last_error, query);
		return SQLITE_ERROR;
	}
}